

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::GenerateAccessorDeclarations
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  RepeatedEnumFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "$deprecated_attr$$type$ $name$(int index) const;\n$deprecated_attr$void set_$name$(int index, $type$ value);\n$deprecated_attr$void add_$name$($type$ value);\n"
                    );
  io::Printer::Print(printer,&this->variables_,
                     "$deprecated_attr$const ::google::protobuf::RepeatedField<int>& $name$() const;\n$deprecated_attr$::google::protobuf::RepeatedField<int>* mutable_$name$();\n"
                    );
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateAccessorDeclarations(io::Printer* printer) const {
  printer->Print(variables_,
    "$deprecated_attr$$type$ $name$(int index) const;\n"
    "$deprecated_attr$void set_$name$(int index, $type$ value);\n"
    "$deprecated_attr$void add_$name$($type$ value);\n");
  printer->Print(variables_,
    "$deprecated_attr$const ::google::protobuf::RepeatedField<int>& $name$() const;\n"
    "$deprecated_attr$::google::protobuf::RepeatedField<int>* mutable_$name$();\n");
}